

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

int Fra_OneHotNodesAreEqual(Fra_Sml_t *pSeq,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  uint *puVar1;
  uint *puVar2;
  int local_3c;
  int i;
  uint *pSims1;
  uint *pSims0;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  Fra_Sml_t *pSeq_local;
  
  puVar1 = Fra_ObjSim(pSeq,pObj0->Id);
  puVar2 = Fra_ObjSim(pSeq,pObj1->Id);
  local_3c = pSeq->nWordsPref;
  while( true ) {
    if (pSeq->nWordsTotal <= local_3c) {
      return 1;
    }
    if (puVar1[local_3c] != puVar2[local_3c]) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Fra_OneHotNodesAreEqual( Fra_Sml_t * pSeq, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    pSims0 = Fra_ObjSim(pSeq, pObj0->Id);
    pSims1 = Fra_ObjSim(pSeq, pObj1->Id);
    for ( i = pSeq->nWordsPref; i < pSeq->nWordsTotal; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}